

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int processInputFile(string *in_file_path)

{
  pointer pcVar1;
  uint nFrames;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uchar *dpcm_buff;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  StkFloat SVar17;
  StkFrames preprocess_buff;
  string in_file_name;
  StkError err;
  FileRead in_file;
  StkFrames floatbuff;
  StkFrames progress_out_buff;
  StkFrames local_198;
  string local_168;
  StkFrames local_148;
  FileRead local_118;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  StkFrames local_90;
  StkFrames local_60;
  
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  getFileNameDeletingDirectory(in_file_path,&local_168);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------------------------------",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"input file: ",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(in_file_path->_M_dataplus)._M_p,
                      in_file_path->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  stk::FileRead::FileRead(&local_118);
  pcVar1 = (in_file_path->_M_dataplus)._M_p;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,pcVar1 + in_file_path->_M_string_length);
  stk::FileRead::open(&local_118,(char *)local_b0,0,0x40d5888000000000,1,2);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  nFrames = (uint)local_118.fileSize_;
  stk::StkFrames::StkFrames(&local_148,nFrames,local_118.channels_);
  stk::FileRead::read(&local_118,(int)&local_148,(void *)0x0,0);
  if (local_118.dataType_ == 2) {
    dVar15 = 32768.0;
  }
  else {
    dVar15 = *(double *)(&DAT_001111a0 + (ulong)(local_118.dataType_ == 1) * 8);
  }
  if (local_118.dataType_ == 4) {
    dVar15 = 8388608.0;
  }
  if (local_118.dataType_ == 8) {
    dVar15 = 2147483648.0;
  }
  uVar7 = (ulong)local_118.channels_;
  stk::StkFrames::StkFrames(&local_90,nFrames,1);
  uVar14 = local_118.fileSize_ & 0xffffffff;
  if (nFrames != 0) {
    uVar6 = 0;
    uVar11 = 0;
    do {
      local_90.data_[uVar11] = 0.0;
      if ((ulong)local_118.channels_ != 0) {
        dVar16 = 0.0;
        uVar12 = (ulong)local_118.channels_;
        uVar13 = uVar6;
        do {
          dVar16 = dVar16 + (local_148.data_[uVar13] / (dVar15 * (double)uVar7)) * wave_gain;
          local_90.data_[uVar11] = dVar16;
          uVar13 = uVar13 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      uVar11 = uVar11 + 1;
      uVar6 = uVar6 + local_118.channels_;
    } while (uVar11 != uVar14);
  }
  if (1 < local_118.channels_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"convert ",8);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," channels to mono.",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  dVar15 = 1789772.5 / (double)sample_rate_cycles[sample_rate_ind];
  uVar6 = (uint)(((double)uVar14 * dVar15) / local_118.fileRate_ + 1.0);
  stk::StkFrames::StkFrames(&local_198,uVar6,1);
  if (no_resampling == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no resampling.",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    stk::StkFrames::resize(&local_198,(long)(int)nFrames,1);
    if (nFrames == 0) {
      nFrames = 0;
    }
    else {
      uVar7 = 0;
      do {
        local_198.data_[uVar7] = local_90.data_[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar14 != uVar7);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"resample ",9);
    poVar4 = std::ostream::_M_insert<double>(local_118.fileRate_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Hz to ",6);
    poVar4 = std::ostream::_M_insert<double>(dVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Hz",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    nFrames = resample(&local_90,local_118.fileRate_,&local_198,uVar6,dVar15,0.995,0x100);
    stk::StkFrames::resize(&local_198,(long)(int)nFrames,1);
  }
  stk::Stk::setSampleRate(dVar15);
  preprocessInputBuffer
            (&local_168,&local_198,dVar15,shifter_weight,center_bias_level,use_linearity_correction)
  ;
  if (output_preprocessed == true) {
    stk::StkFrames::StkFrames(&local_60,(uint)local_198.size_,1);
    if (CONCAT44(local_198.size_._4_4_,(uint)local_198.size_) != 0) {
      lVar10 = 0;
      do {
        dVar16 = local_198.data_[lVar10];
        local_60.data_[lVar10] = dVar16;
        SVar17 = 1.0;
        if ((1.0 < dVar16) || (SVar17 = -1.0, dVar16 < -1.0)) {
          local_60.data_[lVar10] = SVar17;
        }
        lVar10 = lVar10 + 1;
      } while (CONCAT44(local_198.size_._4_4_,(uint)local_198.size_) != lVar10);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"_processed","");
    outputBufferToFile(&local_168,&local_60,&local_d0,dVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    stk::StkFrames::~StkFrames(&local_60);
  }
  iVar8 = nFrames + 0xfe;
  if (-1 < (int)(nFrames + 0x7f)) {
    iVar8 = nFrames + 0x7f;
  }
  iVar9 = (iVar8 >> 7) << 4;
  iVar8 = -1;
  if (-0xff < (int)nFrames) {
    iVar8 = iVar9;
  }
  dpcm_buff = (uchar *)operator_new__((long)iVar8);
  if (force_initial_volume < 0) {
    dVar16 = *local_198.data_ * 64.0;
  }
  else {
    dVar16 = (double)((uint)force_initial_volume >> 1);
  }
  iVar8 = 0;
  if (0 < (int)dVar16 * 2) {
    iVar8 = (int)dVar16 * 2;
  }
  iVar9 = encodeDpcm(&local_198,iVar8,dpcm_buff,iVar9,dither_mode,noise_shape_mode,false);
  iVar2 = decodeDpcm(&local_168,dpcm_buff,iVar9,iVar8,center_bias_level,output_encoded_wav,dVar15);
  iVar3 = outputDpcmToFile(&local_168,dpcm_buff,iVar9,iVar8);
  if (iVar3 != 0) {
    exit(1);
  }
  operator_delete__(dpcm_buff);
  iVar3 = iVar9 + 7;
  if (-1 < iVar9) {
    iVar3 = iVar9;
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3 >> 3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,nFrames);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"samples+",8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9 - nFrames);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"samples padding)",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"initial volume: ",0x10);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max volume: ",0xc);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  stk::StkFrames::~StkFrames(&local_198);
  stk::StkFrames::~StkFrames(&local_90);
  stk::StkFrames::~StkFrames(&local_148);
  stk::FileRead::~FileRead(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int processInputFile(const std::string &in_file_path)
{
	std::string in_file_name;
	getFileNameDeletingDirectory(in_file_path, in_file_name);
	
	std::cout << "----------------------------------" << std::endl;
	std::cout << "input file: " << in_file_path << std::endl;
	
	// 入力ファイルを読み込む
	stk::FileRead in_file;
	try {
		in_file.open(in_file_path);
	}
	catch(stk::StkError err) {
		std::cout << "can not open file: " << in_file_path << std::endl;
		exit(1);
	}
	uint32_t		in_frames = static_cast<uint32_t>(in_file.fileSize());
	stk::StkFloat	in_samplerate = in_file.fileRate();
	stk::StkFrames	filebuff(in_frames, in_file.channels());
	in_file.read(filebuff, 0, false);
	
	// モノラル、float型フォーマットに変換する
	double normalize_gain = 1.0;
	if (in_file.format() == stk::FileRead::STK_SINT8) {
		normalize_gain = 128.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT16) {
		normalize_gain = 32768.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT24) {
		normalize_gain = 8388608.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT32) {
		normalize_gain = 2147483648.0;
	}
	normalize_gain *= in_file.channels();

	stk::StkFrames	floatbuff(in_frames, 1);
	for (uint32_t i=0; i<in_frames; ++i) {
		floatbuff[i] = 0;
		for (unsigned int ch=0; ch<in_file.channels(); ++ch) {
			floatbuff[i] += (filebuff[i*in_file.channels() + ch] / normalize_gain) * wave_gain;
		}
	}
	if (in_file.channels() > 1) {
		std::cout << "convert " << in_file.channels() << " channels to mono." << std::endl;
	}
	
	// 目的のDPCMのサンプリングレートに変換
	double dst_rate = dpcmSampleRateValue(sample_rate_ind);
	int	src_frames = static_cast<int>(in_frames * dst_rate / in_samplerate + 1);
	stk::StkFrames preprocess_buff(src_frames, 1);
	
	if (no_resampling) {
		std::cout << "no resampling." << std::endl;
		src_frames = in_frames;
		preprocess_buff.resize(src_frames);
		for (uint32_t i=0; i<in_frames; ++i) {
			preprocess_buff[i] = floatbuff[i];
		}
		src_frames = in_frames;
	}
	else {
		std::cout << "resample " << in_samplerate << "Hz to " << dst_rate << "Hz" << std::endl;
		src_frames = resample(floatbuff, in_samplerate, preprocess_buff,
							  src_frames, dst_rate, 0.995, resample_window_len);
		preprocess_buff.resize(src_frames);
	}
	
	
	// stkの動作サンプリングレートを変更する
	stk::Stk::setSampleRate(dst_rate);
	
	// 波形の前処理を行う
	preprocessInputBuffer(in_file_name, preprocess_buff, dst_rate,
						  shifter_weight, center_bias_level,
						  use_linearity_correction);
	
	if (output_preprocessed) {
		// 中心補正済み波形を出力
		stk::StkFrames	progress_out_buff((uint32_t)preprocess_buff.size(), 1);
		for (size_t i=0; i<preprocess_buff.size(); ++i) {
			progress_out_buff[i] = preprocess_buff[i];
			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
		}
		outputBufferToFile(in_file_name, progress_out_buff, "_processed", dst_rate);
	}
	
	// DPCM変換の開始
	// サイズは16byte=128sample境界に合うように切り上げ
	int dpcm_frames = ((src_frames + 127) / 128) * 128;
	unsigned char *dpcm = new unsigned char[dpcm_frames / 8];
	int dpcm_initial_volume = 2*static_cast<int>((force_initial_volume >= 0)?(force_initial_volume/2):(preprocess_buff[0] * 64.0));
	if (dpcm_initial_volume < 0) {
		dpcm_initial_volume = 0;
	}
	dpcm_frames = encodeDpcm(preprocess_buff, dpcm_initial_volume,
							 dpcm, dpcm_frames/8, dither_mode, noise_shape_mode,
							 use_linearity_correction);
	
	// 波形最大値を求めるために復号する
	int volume_max = decodeDpcm(in_file_name, dpcm, dpcm_frames, dpcm_initial_volume, center_bias_level, output_encoded_wav, dst_rate);
	
	// dmcファイル出力
	if (outputDpcmToFile(in_file_name, dpcm, dpcm_frames, dpcm_initial_volume)) {
		exit(1);
	}
	
	delete [] dpcm;
	
	std::cout << dpcm_frames/8 << " bytes";
	std::cout << "(" << src_frames << "samples+" << (dpcm_frames - src_frames) << "samples padding)" << std::endl;
	std::cout << "initial volume: " << dpcm_initial_volume << std::endl;
	std::cout << "max volume: " << volume_max << std::endl;
	
	return 0;
}